

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view_archive.cpp
# Opt level: O3

shared_sstring_view *
anon_unknown.dwarf_374d46::SStringViewArchive::make_shared_sstring_view
          (shared_sstring_view *__return_storage_ptr__,char *s)

{
  size_t __n;
  _func_int **__dest;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  shared_sstring_view *extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  
  __n = strlen(s);
  __dest = (_func_int **)operator_new__(__n);
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this->_M_use_count = 1;
  this->_M_weak_count = 1;
  this->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_00270bd8;
  this[1]._vptr__Sp_counted_base = __dest;
  if (__n != 0) {
    memcpy(__dest,s,__n);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this->_M_use_count = this->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this->_M_use_count = 2;
  }
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)__dest;
  (__return_storage_ptr__->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = this;
  __return_storage_ptr__->size_ = __n;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  return extraout_RAX;
}

Assistant:

shared_sstring_view SStringViewArchive::make_shared_sstring_view (char const * s) {
        auto const length = std::strlen (s);
        auto ptr = std::shared_ptr<char> (new char[length], [] (char * p) { delete[] p; });
        std::copy (s, s + length, ptr.get ());
        return {ptr, length};
    }